

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O1

size_t __thiscall slang::ast::Type::hash(Type *this)

{
  SymbolKind SVar1;
  int rest;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  Type *pTVar9;
  Type *pTVar10;
  ulong uVar11;
  size_t sVar12;
  long lVar13;
  IntegralType *it;
  ulong uVar14;
  size_t h;
  ulong local_30;
  size_t local_28;
  
  local_30 = (ulong)(int)(this->super_Symbol).kind;
  pTVar9 = getCanonicalType(this);
  pTVar10 = getCanonicalType(pTVar9);
  if ((pTVar10->super_Symbol).kind == ScalarType) {
    SVar1 = (SymbolKind)pTVar9[1].super_Symbol.name._M_len;
    uVar11 = 1;
LAB_002ad50f:
    if (SVar1 != Definition) {
      uVar11 = (ulong)SVar1;
    }
LAB_002ad512:
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar11;
    uVar11 = SUB168(auVar2 * ZEXT816(0x9e3779b97f4a7c15),8) ^
             SUB168(auVar2 * ZEXT816(0x9e3779b97f4a7c15),0);
    uVar14 = (local_30 >> 2) + local_30 * 0x40;
    lVar13 = 0x9e3779b9;
LAB_002ad53d:
    local_30 = lVar13 + uVar14 + uVar11 ^ local_30;
  }
  else {
    pTVar10 = getCanonicalType(pTVar9);
    if ((pTVar10->super_Symbol).kind == FloatingType) {
      SVar1 = pTVar9[1].super_Symbol.kind;
      uVar11 = 0;
      goto LAB_002ad50f;
    }
    pTVar10 = getCanonicalType(pTVar9);
    bVar8 = IntegralType::isKind((pTVar10->super_Symbol).kind);
    if (bVar8) {
      local_30 = (local_30 >> 2) + local_30 * 0x40 + 0x9e3779b9 +
                 (ulong)(byte)pTVar9[1].super_Symbol.field_0x4 * -0x61c8864680b583eb ^ local_30;
      lVar13 = -0x61c88645e27e0a32;
      if (pTVar9[1].super_Symbol.field_0x5 == '\0') {
        lVar13 = 0x9e3779b9;
      }
      local_30 = (local_30 >> 2) + local_30 * 0x40 + lVar13 ^ local_30;
      auVar7 = ZEXT416(pTVar9[1].super_Symbol.kind) * ZEXT816(0x9e3779b97f4a7c15);
      uVar11 = (local_30 >> 2) + 0x9e3779b9 + local_30 * 0x40 + (auVar7._8_8_ ^ auVar7._0_8_);
LAB_002ad5f1:
      return uVar11 ^ local_30;
    }
    SVar1 = (pTVar9->super_Symbol).kind;
    switch(SVar1) {
    case FixedSizeUnpackedArrayType:
      rest = *(int *)((long)&pTVar9[1].super_Symbol.name._M_len + 4);
      sVar12 = hash(*(Type **)&pTVar9[1].super_Symbol);
      hash_combine<int,int,unsigned_long>(&local_30,(int *)&pTVar9[1].super_Symbol.name,rest,sVar12)
      ;
      break;
    case DynamicArrayType:
      uVar11 = hash(*(Type **)&pTVar9[1].super_Symbol);
      goto LAB_002ad512;
    case DPIOpenArrayType:
      sVar12 = hash(*(Type **)&pTVar9[1].super_Symbol);
      hash_combine<bool,unsigned_long>(&local_30,(bool *)&pTVar9[1].super_Symbol.name,sVar12);
      break;
    case AssociativeArrayType:
      sVar12 = hash(*(Type **)&pTVar9[1].super_Symbol);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = sVar12;
      local_30 = (local_30 >> 2) + local_30 * 0x40 + 0x9e3779b9 +
                 (SUB168(auVar3 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                 SUB168(auVar3 * ZEXT816(0x9e3779b97f4a7c15),0)) ^ local_30;
      pTVar9 = (Type *)pTVar9[1].super_Symbol.name._M_len;
      if (pTVar9 == (Type *)0x0) {
        return local_30;
      }
      sVar12 = hash(pTVar9);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = sVar12;
      uVar11 = SUB168(auVar4 * ZEXT816(0x9e3779b97f4a7c15),8) ^
               SUB168(auVar4 * ZEXT816(0x9e3779b97f4a7c15),0);
      uVar14 = local_30 >> 2;
      lVar13 = local_30 * 0x40 + 0x9e3779b9;
      goto LAB_002ad53d;
    case QueueType:
      local_28 = hash(*(Type **)&pTVar9[1].super_Symbol);
      hash_combine<unsigned_long,unsigned_int>
                (&local_30,&local_28,(uint)pTVar9[1].super_Symbol.name._M_len);
      break;
    default:
      if (SVar1 != VirtualInterfaceType) {
        auVar7._8_8_ = 0;
        auVar7._0_8_ = pTVar9;
        return SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),8) ^
               SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),0);
      }
      auVar5._8_8_ = 0;
      auVar5._0_8_ = *(ulong *)&pTVar9[1].super_Symbol;
      local_30 = (local_30 >> 2) + local_30 * 0x40 + 0x9e3779b9 +
                 (SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar5,8) ^
                 SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar5,0)) ^ local_30;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = pTVar9[1].super_Symbol.name._M_len;
      uVar11 = (SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar6,8) ^
               SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar6,0)) + 0x9e3779b9 +
               (local_30 >> 2) + local_30 * 0x40;
      goto LAB_002ad5f1;
    }
  }
  return local_30;
}

Assistant:

size_t Type::hash() const {
    size_t h = size_t(kind);
    auto& ct = getCanonicalType();
    if (ct.isScalar()) {
        auto sk = ct.as<ScalarType>().scalarKind;
        if (sk == ScalarType::Reg)
            sk = ScalarType::Logic;
        hash_combine(h, sk);
    }
    else if (ct.isFloating()) {
        auto fk = ct.as<FloatingType>().floatKind;
        if (fk == FloatingType::RealTime)
            fk = FloatingType::Real;
        hash_combine(h, fk);
    }
    else if (ct.isIntegral()) {
        auto& it = ct.as<IntegralType>();
        hash_combine(h, it.isSigned, it.isFourState, it.bitWidth);
    }
    else if (ct.kind == SymbolKind::FixedSizeUnpackedArrayType) {
        auto& uat = ct.as<FixedSizeUnpackedArrayType>();
        hash_combine(h, uat.range.left, uat.range.right, uat.elementType.hash());
    }
    else if (ct.kind == SymbolKind::DynamicArrayType) {
        auto& dat = ct.as<DynamicArrayType>();
        hash_combine(h, dat.elementType.hash());
    }
    else if (ct.kind == SymbolKind::DPIOpenArrayType) {
        auto& dat = ct.as<DPIOpenArrayType>();
        hash_combine(h, dat.isPacked, dat.elementType.hash());
    }
    else if (ct.kind == SymbolKind::AssociativeArrayType) {
        auto& aat = ct.as<AssociativeArrayType>();
        hash_combine(h, aat.elementType.hash());
        if (aat.indexType)
            hash_combine(h, aat.indexType->hash());
    }
    else if (ct.kind == SymbolKind::QueueType) {
        auto& qt = ct.as<QueueType>();
        hash_combine(h, qt.elementType.hash(), qt.maxBound);
    }
    else if (ct.kind == SymbolKind::VirtualInterfaceType) {
        auto& vi = ct.as<VirtualInterfaceType>();
        hash_combine(h, &vi.iface);
        hash_combine(h, vi.modport);
    }
    else {
        h = (size_t)slang::hash<const Type*>()(&ct);
    }
    return h;
}